

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

char * __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::GetInterpolationQualifier
          (ConversionStream *this,ShaderParameterInfo *ParamInfo)

{
  int iVar1;
  __type _Var2;
  Char *Message;
  char (*Args_1) [35];
  TokenType kw;
  undefined1 local_48 [8];
  string msg;
  HLSLTokenInfo *Keyword;
  ShaderParameterInfo *ParamInfo_local;
  ConversionStream *this_local;
  
  Args_1 = (char (*) [35])(ulong)(byte)(ParamInfo->interpolationQualifier - Linear);
  switch(Args_1) {
  case (char (*) [35])0x0:
    this_local = (ConversionStream *)anon_var_dwarf_2f9b13;
    break;
  case (char (*) [35])0x1:
    this_local = (ConversionStream *)anon_var_dwarf_2f9b20;
    break;
  case (char (*) [35])0x2:
    this_local = (ConversionStream *)anon_var_dwarf_2f9b2d;
    break;
  case (char (*) [35])0x3:
    this_local = (ConversionStream *)anon_var_dwarf_2f9b3a;
    break;
  case (char (*) [35])0x4:
    this_local = (ConversionStream *)0x49abcb;
    break;
  default:
    msg.field_2._8_8_ =
         Parsing::HLSLTokenizer::FindKeyword(&this->m_Converter->m_HLSLTokenizer,&ParamInfo->Type);
    if ((HLSLTokenInfo *)msg.field_2._8_8_ != (HLSLTokenInfo *)0x0) {
      _Var2 = std::operator==(&((HLSLTokenInfo *)msg.field_2._8_8_)->Literal,&ParamInfo->Type);
      if (!_Var2) {
        FormatString<char[26],char[35]>
                  ((string *)local_48,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Keyword->Literal == ParamInfo.Type",Args_1);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"GetInterpolationQualifier",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xb51);
        std::__cxx11::string::~string((string *)local_48);
      }
      iVar1 = *(int *)msg.field_2._8_8_;
      if ((((((0x2a < iVar1) && (iVar1 < 0x40)) || ((0x3f < iVar1 && (iVar1 < 0x55)))) ||
           ((0x7e < iVar1 && (iVar1 < 0x94)))) || ((0x93 < iVar1 && (iVar1 < 0xa9)))) ||
         ((0xa8 < iVar1 && (iVar1 < 0xbe)))) {
        this_local = (ConversionStream *)anon_var_dwarf_2f9b20;
        return (char *)this_local;
      }
    }
    this_local = (ConversionStream *)0x46c893;
  }
  return (char *)this_local;
}

Assistant:

const char* HLSL2GLSLConverterImpl::ConversionStream::GetInterpolationQualifier(const ShaderParameterInfo& ParamInfo) const
{
    switch (ParamInfo.interpolationQualifier)
    {
        // clang-format off
        case ShaderParameterInfo::InterpolationQualifier::Linear:          return "smooth";
        case ShaderParameterInfo::InterpolationQualifier::Nointerpolation: return "flat";
        case ShaderParameterInfo::InterpolationQualifier::Noperspective:   return "noperspective";
        case ShaderParameterInfo::InterpolationQualifier::Centroid:        return "centroid";
        case ShaderParameterInfo::InterpolationQualifier::Sample:          return "sample";
        // clang-format on
        default:
            break; // To avoid clang/gcc error
    }

    if (const HLSLTokenInfo* Keyword = m_Converter.m_HLSLTokenizer.FindKeyword(ParamInfo.Type))
    {
        VERIFY_EXPR(Keyword->Literal == ParamInfo.Type);
        auto kw = Keyword->Type;
        if ((kw >= TokenType::kw_int && kw <= TokenType::kw_int4x4) ||
            (kw >= TokenType::kw_uint && kw <= TokenType::kw_uint4x4) ||
            (kw >= TokenType::kw_min16int && kw <= TokenType::kw_min16int4x4) ||
            (kw >= TokenType::kw_min12int && kw <= TokenType::kw_min12int4x4) ||
            (kw >= TokenType::kw_min16uint && kw <= TokenType::kw_min16uint4x4))
            return "flat";
    }

    return "";
}